

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t captureVector;
  size_t local_e0;
  size_t i;
  size_t argumentNodeCount;
  size_t lambdaArgumentCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_80_10_5e638c75 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.captureList = (sysbvm_tuple_t)(arguments + 1);
  memset(&gcFrameRecord.roots,0,0x50);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type =
       SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP|
       SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken
                    (context,*(sysbvm_tuple_t *)gcFrame.captureList);
  gcFrameRecord.roots[3] = sVar2;
  lambdaArgumentCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&lambdaArgumentCount);
  if (gcFrameRecord.roots[5] != 0) {
    gcFrame.lambdaNode =
         (sysbvm_astLambdaNode_t *)
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,gcFrameRecord.roots[5],(context->roots).symbolType,
                    *(sysbvm_tuple_t *)gcFrame.captureList);
    gcFrameRecord.roots[5] = (sysbvm_tuple_t)gcFrame.lambdaNode;
    _Var1 = sysbvm_astNode_isLiteralNode(context,(sysbvm_tuple_t)gcFrame.lambdaNode);
    if (!_Var1) {
      sysbvm_error("Local lambda analyzed name must be a literal node.");
    }
    gcFrame.localBinding = sysbvm_astLiteralNode_getValue((sysbvm_tuple_t)gcFrame.lambdaNode);
  }
  argumentNodeCount = 0;
  sVar3 = sysbvm_array_getSize(gcFrameRecord.roots[8]);
  for (local_e0 = 0; local_e0 < sVar3; local_e0 = local_e0 + 1) {
    gcFrame.analyzedNameExpression = sysbvm_array_at(gcFrameRecord.roots[8],local_e0);
    _Var1 = sysbvm_astArgumentNode_isForAll(gcFrame.analyzedNameExpression);
    if (!_Var1) {
      argumentNodeCount = argumentNodeCount + 1;
    }
  }
  gcFrame.argumentNode = sysbvm_tuple_size_encode(context,argumentNodeCount);
  gcFrame.argumentCount =
       sysbvm_functionDefinition_create
                 (context,gcFrameRecord.roots[2],gcFrameRecord.roots[6],gcFrameRecord.roots[7],
                  gcFrame.argumentNode,*(sysbvm_tuple_t *)gcFrame.captureList,gcFrameRecord.roots[8]
                  ,gcFrameRecord.roots[9],gcFrameRecord.roots[10]);
  gcFrameRecord.roots[0xc] = gcFrame.argumentCount;
  sysbvm_analysisEnvironment_addInnerFunction
            (context,*(sysbvm_tuple_t *)gcFrame.captureList,gcFrame.argumentCount);
  sysbvm_functionDefinition_ensureAnalysis
            (context,(sysbvm_functionDefinition_t **)&gcFrame.argumentCount);
  gcFrameRecord.roots[4] = *(sysbvm_tuple_t *)(gcFrame.argumentCount + 0x48);
  if (*(long *)(gcFrame.argumentCount + 0x80) == 0) {
    if (*(long *)(gcFrame.argumentCount + 0x78) == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:1358: assertion failure: gcFrame.functionDefinition->sourceAnalyzedDefinition"
                );
    }
    gcFrame.name = *(sysbvm_tuple_t *)(*(long *)(gcFrame.argumentCount + 0x78) + 0x20);
  }
  else {
    gcFrame.name = *(sysbvm_tuple_t *)(*(long *)(gcFrame.argumentCount + 0x80) + 0x48);
  }
  sVar3 = sysbvm_array_getSize(gcFrame.name);
  sVar2 = gcFrame.argumentCount;
  if (sVar3 == 0) {
    captureVector =
         sysbvm_sequenceTuple_create(context,*(sysbvm_tuple_t *)(gcFrame.argumentCount + 0x40));
    gcFrame.functionDefinition =
         (sysbvm_functionDefinition_t *)
         sysbvm_function_createClosureWithCaptureVector(context,sVar2,captureVector);
    gcFrame.capturelessFunction =
         sysbvm_astLiteralNode_create
                   (context,gcFrameRecord.roots[2],(sysbvm_tuple_t)gcFrame.functionDefinition);
    if (gcFrame.localBinding != 0) {
      gcFrame.capturelessLiteral =
           sysbvm_analysisEnvironment_setNewValueBinding
                     (context,*(sysbvm_tuple_t *)gcFrame.captureList,gcFrameRecord.roots[2],
                      gcFrame.localBinding,(sysbvm_tuple_t)gcFrame.functionDefinition);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&lambdaArgumentCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrame.capturelessFunction;
  }
  else {
    if (gcFrame.localBinding != 0) {
      gcFrame.capturelessLiteral =
           sysbvm_analysisEnvironment_setNewSymbolLocalBinding
                     (context,*(sysbvm_tuple_t *)gcFrame.captureList,gcFrameRecord.roots[2],
                      gcFrame.localBinding,gcFrameRecord.roots[4]);
      gcFrameRecord.roots[0xd] = gcFrame.capturelessLiteral;
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&lambdaArgumentCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrameRecord.roots;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astLambdaNode_t *lambdaNode;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentCount;
        sysbvm_functionDefinition_t *functionDefinition;
        sysbvm_tuple_t capturelessFunction;
        sysbvm_tuple_t capturelessLiteral;
        sysbvm_tuple_t localBinding;
        sysbvm_tuple_t name;
        sysbvm_tuple_t captureList;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.lambdaNode = (sysbvm_astLambdaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.lambdaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.lambdaNode->super.sourcePosition);

    if(gcFrame.lambdaNode->name)
    {
        gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.lambdaNode->name, context->roots.symbolType, *environment);
        gcFrame.lambdaNode->name = gcFrame.analyzedNameExpression;
        if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
            sysbvm_error("Local lambda analyzed name must be a literal node.");
        gcFrame.name = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    }

    // Count the actual argument count.
    size_t lambdaArgumentCount = 0;
    size_t argumentNodeCount = sysbvm_array_getSize(gcFrame.lambdaNode->arguments);
    for(size_t i = 0; i < argumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.lambdaNode->arguments, i);
        if(!sysbvm_astArgumentNode_isForAll(gcFrame.argumentNode))
            ++lambdaArgumentCount;
    }

    gcFrame.argumentCount = sysbvm_tuple_size_encode(context, lambdaArgumentCount);
    gcFrame.functionDefinition = (sysbvm_functionDefinition_t *)sysbvm_functionDefinition_create(context,
        gcFrame.lambdaNode->super.sourcePosition, gcFrame.lambdaNode->flags, gcFrame.lambdaNode->callingConventionName,
        gcFrame.argumentCount, *environment,
        gcFrame.lambdaNode->arguments, gcFrame.lambdaNode->resultType, gcFrame.lambdaNode->body
    );
    gcFrame.lambdaNode->functionDefinition = (sysbvm_tuple_t)gcFrame.functionDefinition;

    // Register the inner function.
    sysbvm_analysisEnvironment_addInnerFunction(context, *environment, (sysbvm_tuple_t)gcFrame.functionDefinition);

    // Perform the lambda analysis.
    sysbvm_functionDefinition_ensureAnalysis(context, &gcFrame.functionDefinition);

    gcFrame.lambdaNode->super.analyzedType = gcFrame.functionDefinition->type;
    if(gcFrame.functionDefinition->bytecode)
    {
        gcFrame.captureList = ((sysbvm_functionBytecode_t*)gcFrame.functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(gcFrame.functionDefinition->sourceAnalyzedDefinition);
        gcFrame.captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    // Optimize lambdas without captures by turning them onto a literal.
    if(sysbvm_array_getSize(gcFrame.captureList) == 0)
    {
        gcFrame.capturelessFunction = sysbvm_function_createClosureWithCaptureVector(context, (sysbvm_tuple_t)gcFrame.functionDefinition, sysbvm_sequenceTuple_create(context, gcFrame.functionDefinition->captureVectorType));
        gcFrame.capturelessLiteral = sysbvm_astLiteralNode_create(context, gcFrame.lambdaNode->super.sourcePosition, gcFrame.capturelessFunction);
        if(gcFrame.name)
            gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.capturelessFunction);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.capturelessLiteral;
    }

    if(gcFrame.name)
    {
        gcFrame.localBinding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.lambdaNode->super.sourcePosition, gcFrame.name, gcFrame.lambdaNode->super.analyzedType);
        gcFrame.lambdaNode->binding = gcFrame.localBinding;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.lambdaNode;
}